

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS ref_face_make_canonical(REF_INT *original,REF_INT *canonical)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *canonical_local;
  REF_INT *original_local;
  
  original_local._4_4_ = ref_sort_insertion_int(4,original,canonical);
  if (original_local._4_4_ == 0) {
    if (*canonical == canonical[1]) {
      *canonical = -1;
      original_local._4_4_ = 0;
    }
    else if (canonical[1] == canonical[2]) {
      canonical[1] = *canonical;
      *canonical = -1;
      original_local._4_4_ = 0;
    }
    else if (canonical[2] == canonical[3]) {
      canonical[2] = canonical[1];
      canonical[1] = *canonical;
      *canonical = -1;
      original_local._4_4_ = 0;
    }
    else {
      original_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x6b,
           "ref_face_make_canonical",(ulong)original_local._4_4_,"sort");
  }
  return original_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_face_make_canonical(REF_INT *original,
                                                  REF_INT *canonical) {
  RSS(ref_sort_insertion_int(4, original, canonical), "sort");

  if (canonical[0] == canonical[1]) {
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (canonical[1] == canonical[2]) {
    canonical[1] = canonical[0];
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (canonical[2] == canonical[3]) {
    canonical[2] = canonical[1];
    canonical[1] = canonical[0];
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}